

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

aiNode * __thiscall Assimp::BVHLoader::ReadEndSite(BVHLoader *this,string *pParentName)

{
  bool bVar1;
  aiNode *this_00;
  string openBrace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  GetNextToken_abi_cxx11_(&local_1e0,this);
  bVar1 = std::operator!=(&local_1e0,"{");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::operator<<((ostream *)local_1a0,"Expected opening brace \"{\", but found \"");
    std::operator<<((ostream *)local_1a0,(string *)&local_1e0);
    std::operator<<((ostream *)local_1a0,"\".");
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_200);
  }
  this_00 = (aiNode *)operator_new(0x478);
  std::operator+(local_1a0,"EndSite_",pParentName);
  aiNode::aiNode(this_00,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200.field_2._M_local_buf[0] = '\0';
  while( true ) {
    local_200._M_string_length = 0;
    *local_200._M_dataplus._M_p = '\0';
    GetNextToken_abi_cxx11_(local_1a0,this);
    std::__cxx11::string::operator=((string *)&local_200,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    bVar1 = std::operator==(&local_200,"OFFSET");
    if (!bVar1) break;
    ReadNodeOffset(this,this_00);
  }
  bVar1 = std::operator==(&local_200,"}");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    return this_00;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"Unknown keyword \"");
  std::operator<<((ostream *)local_1a0,(string *)&local_200);
  std::operator<<((ostream *)local_1a0,"\".");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1c0);
}

Assistant:

aiNode* BVHLoader::ReadEndSite( const std::string& pParentName)
{
    // check opening brace
    std::string openBrace = GetNextToken();
    if( openBrace != "{")
        ThrowException( format() << "Expected opening brace \"{\", but found \"" << openBrace << "\".");

    // Create a node
    aiNode* node = new aiNode( "EndSite_" + pParentName);

    // now read the node's contents. Only possible entry is "OFFSET"
    std::string token;
    while( 1) {
        token.clear();
        token = GetNextToken();

        // end node's offset
        if( token == "OFFSET") {
            ReadNodeOffset( node);
        } else if( token == "}") {
            // we're done with the end node
            break;
        } else {
            // everything else is a parse error
            ThrowException( format() << "Unknown keyword \"" << token << "\"." );
        }
    }

    // and return the sub-hierarchy we built here
    return node;
}